

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::MergePartialFromCodedStream
          (CustomLayerParams_CustomLayerParamValue *this,CodedInputStream *input)

{
  ValueUnion *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  string *in_RAX;
  unsigned_long uVar7;
  undefined8 *puVar8;
  uint uVar9;
  char cVar10;
  ulong uVar11;
  ValueUnion value;
  string *psVar12;
  pair<unsigned_long,_bool> pVar13;
  string *local_38;
  
  this_00 = &this->value_;
  local_38 = in_RAX;
LAB_003b767e:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar9 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar9, (~(uint)*pbVar1 & uVar9) < 0x80))
        goto LAB_003b78b7;
        uVar11 = (ulong)((uVar9 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_003b78b7:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) != 0) {
      uVar9 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar9 == 0x32) {
        if (cVar10 == -0x70) {
          clear_value(this);
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar7 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this_00->boolvalue_ = uVar7 != 0;
          goto LAB_003b78ef;
        }
        goto LAB_003b76db;
      }
      if (uVar9 == 0x14) {
        if (cVar10 != -0x5e) goto LAB_003b76db;
        if (this->_oneof_case_[0] == 0x14) {
          value.stringvalue_.ptr_ = (ArenaStringPtr)this_00->longvalue_;
          if ((string *)value.longvalue_ ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
          goto LAB_003b7840;
        }
        else {
          clear_value(this);
          this->_oneof_case_[0] = 0x14;
          this->value_ = (ValueUnion)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
LAB_003b7840:
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this_00->stringvalue_,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          value.stringvalue_.ptr_ = *(ArenaStringPtr *)this_00;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
        if (!bVar5) {
          return false;
        }
        puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        if (this->_oneof_case_[0] == 0x14) {
          puVar8 = (undefined8 *)(this->value_).longvalue_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          ((char *)*puVar8,*(int *)(puVar8 + 1),PARSE,
                           "CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue"
                          );
        if (!bVar5) {
          return false;
        }
      }
      else {
        if (uVar9 == 0x1e) {
          if (cVar10 != -0x10) goto LAB_003b76db;
          clear_value(this);
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar2 = *pbVar3;
            uVar11 = (ulong)bVar2;
            uVar6 = (uint32)bVar2;
            if ((char)bVar2 < '\0') goto LAB_003b78dd;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar6 = 0;
LAB_003b78dd:
            uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
            if ((long)uVar11 < 0) {
              return false;
            }
          }
          this_00->intvalue_ = (int32)uVar11;
        }
        else if (uVar9 == 0x28) {
          if (cVar10 != '@') goto LAB_003b76db;
          clear_value(this);
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar7 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this_00->longvalue_ = uVar7;
        }
        else {
          if ((uVar9 != 10) || (cVar10 != 'Q')) goto LAB_003b76db;
          clear_value(this);
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_38);
            psVar12 = local_38;
            if (!bVar5) {
              return false;
            }
          }
          else {
            psVar12 = *(string **)puVar4;
            input->buffer_ = puVar4 + 8;
          }
          *(string **)&this_00->intvalue_ = psVar12;
        }
LAB_003b78ef:
        this->_oneof_case_[0] = uVar9;
      }
      goto LAB_003b767e;
    }
LAB_003b76db:
    if (uVar6 == 0) {
      return true;
    }
    if ((uVar6 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool CustomLayerParams_CustomLayerParamValue::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double doubleValue = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(81u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &value_.doublevalue_)));
          set_has_doublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string stringValue = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_stringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->stringvalue().data(), this->stringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.CustomLayerParamValue.stringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 intValue = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(240u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &value_.intvalue_)));
          set_has_intvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 longValue = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &value_.longvalue_)));
          set_has_longvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool boolValue = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {
          clear_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &value_.boolvalue_)));
          set_has_boolvalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  return false;
#undef DO_
}